

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

bool __thiscall Assimp::XGLImporter::SkipToText(XGLImporter *this)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  allocator<char> local_39;
  string local_38;
  XGLImporter *local_18;
  XGLImporter *this_local;
  
  local_18 = this;
LAB_009d1364:
  peVar3 = std::
           __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_reader);
  uVar1 = (*peVar3->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar3->_vptr_IIrrXMLReader[3])();
    if (iVar2 != 3) {
      peVar3 = std::
               __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_reader);
      iVar2 = (*peVar3->_vptr_IIrrXMLReader[3])();
      if (iVar2 != 1) goto code_r0x009d13c2;
      goto LAB_009d13dd;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
code_r0x009d13c2:
  peVar3 = std::
           __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_reader);
  iVar2 = (*peVar3->_vptr_IIrrXMLReader[3])();
  if (iVar2 == 2) {
LAB_009d13dd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "expected text contents but found another element (or element end)",&local_39);
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  goto LAB_009d1364;
}

Assistant:

bool XGLImporter::SkipToText()
{
    while(m_reader->read()) {
        if (m_reader->getNodeType() == EXN_TEXT) {
            return true;
        }
        else if (m_reader->getNodeType() == EXN_ELEMENT || m_reader->getNodeType() == EXN_ELEMENT_END) {
            ThrowException("expected text contents but found another element (or element end)");
        }
    }
    return false;
}